

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

string_type * __thiscall
booster::locale::basic_format<wchar_t>::str_abi_cxx11_
          (string_type *__return_storage_ptr__,basic_format<wchar_t> *this,locale *loc)

{
  size_t in_RCX;
  void *__buf;
  locale local_1a0 [8];
  wostringstream local_198 [8];
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> buffer;
  locale *loc_local;
  basic_format<wchar_t> *this_local;
  
  std::__cxx11::wostringstream::wostringstream(local_198);
  std::wios::imbue(local_1a0);
  std::locale::~locale(local_1a0);
  write(this,(int)local_198,__buf,in_RCX);
  std::__cxx11::wostringstream::str();
  std::__cxx11::wostringstream::~wostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string_type str(std::locale const &loc = std::locale()) const
            {
                std::basic_ostringstream<CharType> buffer;
                buffer.imbue(loc);
                write(buffer);
                return buffer.str();
            }